

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O2

ip_filter * __thiscall
libtorrent::session_handle::
sync_call_ret<libtorrent::ip_filter,libtorrent::ip_filter_const&(libtorrent::aux::session_impl::*)()>
          (ip_filter *__return_storage_ptr__,session_handle *this,offset_in_session_impl_to_subr f)

{
  io_context *ctx;
  undefined8 uVar1;
  bool done;
  exception_ptr ex;
  shared_ptr<libtorrent::aux::session_impl> s;
  bool local_81;
  exception_ptr local_80;
  __shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> local_78;
  exception_ptr local_68;
  type_conflict5 local_60;
  
  ::std::__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_78);
  if (local_78._M_ptr == (session_impl *)0x0) {
    local_60.r = (ip_filter *)CONCAT44(local_60.r._4_4_,0x73);
    aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              ((error_code_enum *)&local_60);
  }
  local_81 = false;
  ip_filter::ip_filter(__return_storage_ptr__);
  local_60.ex = &local_80;
  local_80._M_exception_object = (void *)0x0;
  ctx = (local_78._M_ptr)->m_io_context;
  local_60.done = &local_81;
  local_60.r = __return_storage_ptr__;
  ::std::__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_60.s.
              super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>,
             &local_78);
  local_60.f = f;
  boost::asio::
  dispatch<boost::asio::io_context,libtorrent::session_handle::sync_call_ret<libtorrent::ip_filter,libtorrent::ip_filter_const&(libtorrent::aux::session_impl::*)()>(libtorrent::ip_filter_const&(libtorrent::aux::session_impl::*)())const::_lambda()_1_>
            (ctx,&local_60,(type *)0x0);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_60.s.
              super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  aux::torrent_wait(&local_81,local_78._M_ptr);
  if (local_80._M_exception_object == (void *)0x0) {
    ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_80);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
    return __return_storage_ptr__;
  }
  ::std::__exception_ptr::exception_ptr::exception_ptr(&local_68,&local_80);
  uVar1 = ::std::rethrow_exception((exception_ptr)&local_68);
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_68);
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_80);
  ip_filter::~ip_filter(__return_storage_ptr__);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  _Unwind_Resume(uVar1);
}

Assistant:

Ret session_handle::sync_call_ret(Fun f, Args&&... a) const
	{
		std::shared_ptr<session_impl> s = m_impl.lock();
		if (!s) aux::throw_ex<system_error>(errors::invalid_session_handle);

		// this is the flag to indicate the call has completed
		// capture them by pointer to allow everything to be captured by value
		// and simplify the capture expression
		bool done = false;
		Ret r;
		std::exception_ptr ex;
		dispatch(s->get_context(), [=, &r, &done, &ex]() mutable
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				r = (s.get()->*f)(std::forward<Args>(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (...) {
				ex = std::current_exception();
			}
#endif
			std::unique_lock<std::mutex> l(s->mut);
			done = true;
			s->cond.notify_all();
		});

		aux::torrent_wait(done, *s);
		if (ex) std::rethrow_exception(ex);
		return r;
	}